

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O3

CatalogEntryLookup *
duckdb::Catalog::TryLookupDefaultTable
          (CatalogEntryLookup *__return_storage_ptr__,CatalogEntryRetriever *retriever,
          string *catalog,string *schema,EntryLookupInfo *lookup_info,OnEntryNotFound if_not_found)

{
  pointer pcVar1;
  optional_ptr<duckdb::Catalog,_true> __args;
  optional_ptr<duckdb::Catalog,_true> catalog_by_name;
  vector<duckdb::CatalogLookup,_true> catalog_by_name_lookups;
  CatalogType local_91;
  optional_ptr<duckdb::Catalog,_true> local_90;
  vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (catalog->_M_string_length == 0 && schema->_M_string_length == 0) {
    local_88.super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90 = GetCatalogEntry(retriever,lookup_info->name);
    if (local_90.ptr != (Catalog *)0x0) {
      optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_90);
      if (((local_90.ptr)->default_table)._M_string_length != 0) {
        optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_90);
        __args.ptr = local_90.ptr;
        local_91 = TABLE_ENTRY;
        optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_90);
        GetDefaultTableSchema_abi_cxx11_(&local_50,local_90.ptr);
        optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_90);
        pcVar1 = ((local_90.ptr)->default_table)._M_dataplus._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,
                   pcVar1 + ((local_90.ptr)->default_table)._M_string_length);
        ::std::vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>>::
        emplace_back<duckdb::Catalog&,duckdb::CatalogType,std::__cxx11::string,std::__cxx11::string>
                  ((vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>> *)&local_88,
                   __args.ptr,&local_91,&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
    TryLookupEntry(__return_storage_ptr__,retriever,(vector<duckdb::CatalogLookup,_true> *)&local_88
                   ,lookup_info,if_not_found);
    ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::~vector(&local_88)
    ;
  }
  else {
    (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
    (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
    ErrorData::ErrorData(&__return_storage_ptr__->error);
  }
  return __return_storage_ptr__;
}

Assistant:

CatalogEntryLookup Catalog::TryLookupDefaultTable(CatalogEntryRetriever &retriever, const string &catalog,
                                                  const string &schema, const EntryLookupInfo &lookup_info,
                                                  OnEntryNotFound if_not_found) {
	// Default tables of catalogs can only be accessed by the catalog name directly
	if (!schema.empty() || !catalog.empty()) {
		return {nullptr, nullptr, ErrorData()};
	}

	vector<CatalogLookup> catalog_by_name_lookups;
	auto catalog_by_name = GetCatalogEntry(retriever, lookup_info.GetEntryName());
	if (catalog_by_name && catalog_by_name->HasDefaultTable()) {
		catalog_by_name_lookups.emplace_back(*catalog_by_name, CatalogType::TABLE_ENTRY,
		                                     catalog_by_name->GetDefaultTableSchema(),
		                                     catalog_by_name->GetDefaultTable());
	}

	return TryLookupEntry(retriever, catalog_by_name_lookups, lookup_info, if_not_found);
}